

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O2

void __thiscall xray_re::xr_ogf_v3::load_loddata(xr_ogf_v3 *this,xr_reader *r)

{
  byte *pbVar1;
  uint uVar2;
  uint32_t *puVar3;
  uint *puVar4;
  size_t sVar5;
  ogf3_vsplit *values;
  unsigned_short *values_00;
  ulong n;
  
  sVar5 = xr_reader::find_chunk(r,1);
  if (sVar5 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                  ,0xba,"void xray_re::xr_ogf_v3::load_loddata(xr_reader &)");
  }
  puVar3 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
  this->m_min_vertices = *puVar3;
  puVar3 = (r->field_2).m_p_u32;
  (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
  this->m_min_indices = *puVar3;
  sVar5 = xr_reader::find_chunk(r,2);
  if (sVar5 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                  ,0xc0,"void xray_re::xr_ogf_v3::load_loddata(xr_reader &)");
  }
  if (((this->super_xr_ogf).m_loaded & 0x80) == 0) {
    __assert_fail("is_chunk_loaded(OGF3_VERTICES)",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                  ,0xc1,"void xray_re::xr_ogf_v3::load_loddata(xr_reader &)");
  }
  n = (this->super_xr_ogf).m_vb.super_xr_flexbuf.m_size - (ulong)this->m_min_vertices;
  values = (ogf3_vsplit *)operator_new__(-(ulong)(n >> 0x3e != 0) | n * 4);
  this->m_vsplits = values;
  xr_reader::r_cseq<xray_re::ogf3_vsplit>(r,n,values);
  sVar5 = xr_reader::find_chunk(r,3);
  if (sVar5 != 0) {
    puVar4 = (r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(puVar4 + 1);
    uVar2 = *puVar4;
    this->m_num_fix_faces = uVar2;
    values_00 = (unsigned_short *)operator_new__((ulong)uVar2 * 2);
    this->m_fix_faces = values_00;
    xr_reader::r_cseq<unsigned_short>(r,(ulong)uVar2,values_00);
    setup_ib0(this);
    pbVar1 = (byte *)((long)&(this->super_xr_ogf).m_loaded + 1);
    *pbVar1 = *pbVar1 | 2;
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                ,200,"void xray_re::xr_ogf_v3::load_loddata(xr_reader &)");
}

Assistant:

inline void xr_ogf_v3::load_loddata(xr_reader& r)
{
	if (!r.find_chunk(OGF3_HOPPE_HEADER))
		xr_not_expected();
	m_min_vertices = r.r_u32();
	m_min_indices = r.r_u32();
	r.debug_find_chunk();

	if (!r.find_chunk(OGF3_HOPPE_VERT_SPLITS))
		xr_not_expected();
	xr_assert(is_chunk_loaded(OGF3_VERTICES));
	size_t num_vsplits = m_vb.size() - m_min_vertices;
	m_vsplits = new ogf3_vsplit[num_vsplits];
	r.r_cseq(num_vsplits, m_vsplits);
	r.debug_find_chunk();

	if (!r.find_chunk(OGF3_HOPPE_FIX_FACES))
		xr_not_expected();
	m_num_fix_faces = r.r_u32();
	m_fix_faces = new uint16_t[m_num_fix_faces];
	r.r_cseq(m_num_fix_faces, m_fix_faces);
	r.debug_find_chunk();

	setup_ib0();

	set_chunk_loaded(OGF3_LODDATA);
}